

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  long lVar15;
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  ulong *puVar35;
  byte bVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  uint uVar40;
  undefined4 uVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  float fVar60;
  float fVar65;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar61 [16];
  float fVar64;
  float fVar66;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  ulong *local_16b8;
  undefined8 local_1690;
  undefined1 local_1670 [16];
  undefined1 (*local_1658) [16];
  ulong *local_1650;
  ulong local_1648;
  ulong local_1640;
  ulong local_1638;
  ulong local_1630;
  ulong local_1628;
  ulong local_1620;
  long local_1618;
  long local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  long local_15d8;
  RTCFilterFunctionNArguments local_15d0;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined4 local_14f0;
  undefined4 uStack_14ec;
  undefined4 uStack_14e8;
  undefined4 uStack_14e4;
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined1 local_1490 [16];
  uint local_1480;
  uint uStack_147c;
  uint uStack_1478;
  uint uStack_1474;
  uint uStack_1470;
  uint uStack_146c;
  uint uStack_1468;
  uint uStack_1464;
  undefined1 local_1460 [8];
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar112 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(
                                                  fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_13c0._4_4_ = fVar2;
  local_13c0._0_4_ = fVar2;
  local_13c0._8_4_ = fVar2;
  local_13c0._12_4_ = fVar2;
  local_13c0._16_4_ = fVar2;
  local_13c0._20_4_ = fVar2;
  local_13c0._24_4_ = fVar2;
  local_13c0._28_4_ = fVar2;
  auVar87 = ZEXT3264(local_13c0);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_13e0._4_4_ = fVar3;
  local_13e0._0_4_ = fVar3;
  local_13e0._8_4_ = fVar3;
  local_13e0._12_4_ = fVar3;
  local_13e0._16_4_ = fVar3;
  local_13e0._20_4_ = fVar3;
  local_13e0._24_4_ = fVar3;
  local_13e0._28_4_ = fVar3;
  auVar89 = ZEXT3264(local_13e0);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar50 = uVar46 ^ 0x20;
  uVar51 = uVar47 ^ 0x20;
  uVar43 = uVar49 ^ 0x20;
  local_13a0._8_4_ = 0x80000000;
  local_13a0._0_8_ = 0x8000000080000000;
  local_13a0._12_4_ = 0x80000000;
  local_13a0._16_4_ = 0x80000000;
  local_13a0._20_4_ = 0x80000000;
  local_13a0._24_4_ = 0x80000000;
  local_13a0._28_4_ = 0x80000000;
  local_1400._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1400._8_4_ = -fVar1;
  local_1400._12_4_ = -fVar1;
  local_1400._16_4_ = -fVar1;
  local_1400._20_4_ = -fVar1;
  local_1400._24_4_ = -fVar1;
  local_1400._28_4_ = -fVar1;
  auVar93 = ZEXT3264(local_1400);
  local_1420._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1420._8_4_ = -fVar2;
  local_1420._12_4_ = -fVar2;
  local_1420._16_4_ = -fVar2;
  local_1420._20_4_ = -fVar2;
  local_1420._24_4_ = -fVar2;
  local_1420._28_4_ = -fVar2;
  auVar95 = ZEXT3264(local_1420);
  local_1540._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_1540._8_4_ = -fVar3;
  local_1540._12_4_ = -fVar3;
  local_1540._16_4_ = -fVar3;
  local_1540._20_4_ = -fVar3;
  local_1540._24_4_ = -fVar3;
  local_1540._28_4_ = -fVar3;
  auVar104 = ZEXT3264(local_1540);
  iVar37 = (tray->tnear).field_0.i[k];
  local_1560._4_4_ = iVar37;
  local_1560._0_4_ = iVar37;
  local_1560._8_4_ = iVar37;
  local_1560._12_4_ = iVar37;
  local_1560._16_4_ = iVar37;
  local_1560._20_4_ = iVar37;
  local_1560._24_4_ = iVar37;
  local_1560._28_4_ = iVar37;
  auVar107 = ZEXT3264(local_1560);
  iVar37 = (tray->tfar).field_0.i[k];
  local_1580._4_4_ = iVar37;
  local_1580._0_4_ = iVar37;
  local_1580._8_4_ = iVar37;
  local_1580._12_4_ = iVar37;
  local_1580._16_4_ = iVar37;
  local_1580._20_4_ = iVar37;
  local_1580._24_4_ = iVar37;
  local_1580._28_4_ = iVar37;
  auVar111 = ZEXT3264(local_1580);
  local_1620 = uVar46 >> 2;
  local_1628 = uVar50 >> 2;
  local_1440._16_16_ = mm_lookupmask_ps._240_16_;
  local_1440._0_16_ = mm_lookupmask_ps._0_16_;
  local_1658 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_1630 = uVar47 >> 2;
  local_1638 = uVar51 >> 2;
  local_1640 = uVar49 >> 2;
  local_1648 = uVar43 >> 2;
  auVar98._8_4_ = 0xbf800000;
  auVar98._0_8_ = 0xbf800000bf800000;
  auVar98._12_4_ = 0xbf800000;
  auVar98._16_4_ = 0xbf800000;
  auVar98._20_4_ = 0xbf800000;
  auVar98._24_4_ = 0xbf800000;
  auVar98._28_4_ = 0xbf800000;
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar74._16_4_ = 0x3f800000;
  auVar74._20_4_ = 0x3f800000;
  auVar74._24_4_ = 0x3f800000;
  auVar74._28_4_ = 0x3f800000;
  _local_1460 = vblendvps_avx(auVar74,auVar98,local_1440);
  puVar35 = local_11f8;
  local_1608 = uVar43;
  local_1600 = uVar51;
  local_15f8 = uVar50;
  local_15f0 = uVar49;
  local_15e8 = uVar47;
  local_15e0 = uVar46;
LAB_016908ad:
  do {
    local_1650 = puVar35;
    if (local_1650 == &local_1200) {
LAB_0169137d:
      return local_1650 != &local_1200;
    }
    local_16b8 = local_1650 + -1;
    uVar53 = local_1650[-1];
    while ((uVar53 & 8) == 0) {
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar46),auVar93._0_32_,
                                auVar112._0_32_);
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar47),auVar95._0_32_,
                                auVar87._0_32_);
      auVar98 = vpmaxsd_avx2(ZEXT1632(auVar55),ZEXT1632(auVar23));
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar49),auVar104._0_32_,
                                auVar89._0_32_);
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar50),auVar93._0_32_,
                                auVar112._0_32_);
      auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar51),auVar95._0_32_,
                                auVar87._0_32_);
      auVar78 = vpminsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar24));
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar43),auVar104._0_32_,
                                auVar89._0_32_);
      auVar74 = vpmaxsd_avx2(ZEXT1632(auVar55),auVar107._0_32_);
      auVar98 = vpmaxsd_avx2(auVar98,auVar74);
      auVar74 = vpminsd_avx2(ZEXT1632(auVar23),auVar111._0_32_);
      auVar74 = vpminsd_avx2(auVar78,auVar74);
      auVar98 = vpcmpgtd_avx2(auVar98,auVar74);
      iVar37 = vmovmskps_avx(auVar98);
      puVar35 = local_16b8;
      if (iVar37 == 0xff) goto LAB_016908ad;
      bVar36 = ~(byte)iVar37;
      uVar38 = uVar53 & 0xfffffffffffffff0;
      lVar39 = 0;
      for (uVar53 = (ulong)bVar36; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
        lVar39 = lVar39 + 1;
      }
      uVar53 = *(ulong *)(uVar38 + lVar39 * 8);
      uVar40 = bVar36 - 1 & (uint)bVar36;
      uVar42 = (ulong)uVar40;
      if (uVar40 != 0) {
        do {
          *local_16b8 = uVar53;
          local_16b8 = local_16b8 + 1;
          lVar39 = 0;
          for (uVar53 = uVar42; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          uVar42 = uVar42 - 1 & uVar42;
          uVar53 = *(ulong *)(uVar38 + lVar39 * 8);
        } while (uVar42 != 0);
      }
    }
    local_1618 = (ulong)((uint)uVar53 & 0xf) - 8;
    uVar53 = uVar53 & 0xfffffffffffffff0;
    for (local_1610 = 0; puVar35 = local_16b8, local_1610 != local_1618; local_1610 = local_1610 + 1
        ) {
      lVar39 = local_1610 * 0x90;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)(uVar53 + 0x40 + lVar39);
      auVar24 = vpmovzxbw_avx(auVar55);
      local_15d8 = lVar39 + uVar53;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(uVar53 + 0x48 + lVar39);
      auVar55 = vpmovzxbw_avx(auVar23);
      auVar55 = vpminuw_avx(auVar24,auVar55);
      auVar55 = vpcmpeqw_avx(auVar24,auVar55);
      auVar55 = vpacksswb_avx(auVar55,auVar55);
      uVar41 = *(undefined4 *)(uVar53 + 0x70 + lVar39);
      auVar78._4_4_ = uVar41;
      auVar78._0_4_ = uVar41;
      auVar78._8_4_ = uVar41;
      auVar78._12_4_ = uVar41;
      auVar78._16_4_ = uVar41;
      auVar78._20_4_ = uVar41;
      auVar78._24_4_ = uVar41;
      auVar78._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(uVar53 + 0x7c + lVar39);
      auVar81._4_4_ = uVar41;
      auVar81._0_4_ = uVar41;
      auVar81._8_4_ = uVar41;
      auVar81._12_4_ = uVar41;
      auVar81._16_4_ = uVar41;
      auVar81._20_4_ = uVar41;
      auVar81._24_4_ = uVar41;
      auVar81._28_4_ = uVar41;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(local_1620 + 0x40 + local_15d8);
      auVar98 = vpmovzxbd_avx2(auVar24);
      auVar98 = vcvtdq2ps_avx(auVar98);
      auVar23 = vfmadd213ps_fma(auVar98,auVar81,auVar78);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(local_1628 + 0x40 + local_15d8);
      auVar98 = vpmovzxbd_avx2(auVar4);
      auVar98 = vcvtdq2ps_avx(auVar98);
      auVar24 = vfmadd213ps_fma(auVar98,auVar81,auVar78);
      uVar41 = *(undefined4 *)(uVar53 + 0x74 + lVar39);
      auVar79._4_4_ = uVar41;
      auVar79._0_4_ = uVar41;
      auVar79._8_4_ = uVar41;
      auVar79._12_4_ = uVar41;
      auVar79._16_4_ = uVar41;
      auVar79._20_4_ = uVar41;
      auVar79._24_4_ = uVar41;
      auVar79._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(uVar53 + 0x80 + lVar39);
      auVar82._4_4_ = uVar41;
      auVar82._0_4_ = uVar41;
      auVar82._8_4_ = uVar41;
      auVar82._12_4_ = uVar41;
      auVar82._16_4_ = uVar41;
      auVar82._20_4_ = uVar41;
      auVar82._24_4_ = uVar41;
      auVar82._28_4_ = uVar41;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(local_1630 + 0x40 + local_15d8);
      auVar98 = vpmovzxbd_avx2(auVar5);
      auVar98 = vcvtdq2ps_avx(auVar98);
      auVar4 = vfmadd213ps_fma(auVar98,auVar82,auVar79);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(local_1638 + 0x40 + local_15d8);
      auVar98 = vpmovzxbd_avx2(auVar6);
      auVar98 = vcvtdq2ps_avx(auVar98);
      auVar5 = vfmadd213ps_fma(auVar98,auVar82,auVar79);
      uVar41 = *(undefined4 *)(uVar53 + 0x78 + lVar39);
      auVar80._4_4_ = uVar41;
      auVar80._0_4_ = uVar41;
      auVar80._8_4_ = uVar41;
      auVar80._12_4_ = uVar41;
      auVar80._16_4_ = uVar41;
      auVar80._20_4_ = uVar41;
      auVar80._24_4_ = uVar41;
      auVar80._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(uVar53 + 0x84 + lVar39);
      auVar83._4_4_ = uVar41;
      auVar83._0_4_ = uVar41;
      auVar83._8_4_ = uVar41;
      auVar83._12_4_ = uVar41;
      auVar83._16_4_ = uVar41;
      auVar83._20_4_ = uVar41;
      auVar83._24_4_ = uVar41;
      auVar83._28_4_ = uVar41;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(local_1640 + 0x40 + local_15d8);
      auVar98 = vpmovzxbd_avx2(auVar7);
      auVar98 = vcvtdq2ps_avx(auVar98);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(local_1648 + 0x40 + local_15d8);
      auVar74 = vpmovzxbd_avx2(auVar8);
      auVar6 = vfmadd213ps_fma(auVar98,auVar83,auVar80);
      auVar98 = vcvtdq2ps_avx(auVar74);
      auVar7 = vfmadd213ps_fma(auVar98,auVar83,auVar80);
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar112._0_32_,auVar93._0_32_);
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar87._0_32_,auVar95._0_32_);
      auVar98 = vpmaxsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar4));
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar89._0_32_,auVar104._0_32_);
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar112._0_32_,auVar93._0_32_);
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar87._0_32_,auVar95._0_32_);
      auVar78 = vpminsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar4));
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar89._0_32_,auVar104._0_32_);
      auVar74 = vpmaxsd_avx2(ZEXT1632(auVar23),auVar107._0_32_);
      auVar98 = vpmaxsd_avx2(auVar98,auVar74);
      auVar74 = vpminsd_avx2(ZEXT1632(auVar24),auVar111._0_32_);
      auVar74 = vpminsd_avx2(auVar78,auVar74);
      auVar98 = vpcmpgtd_avx2(auVar98,auVar74);
      uVar41 = vmovmskps_avx(auVar98);
      for (uVar38 = (ulong)(byte)(~(byte)uVar41 &
                                 (SUB161(auVar55 >> 7,0) & 1 | (SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar55 >> 0x3f,0) << 7)); uVar38 != 0;
          uVar38 = uVar38 - 1 & uVar38) {
        lVar39 = 0;
        for (uVar43 = uVar38; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
          lVar39 = lVar39 + 1;
        }
        uVar9 = *(ushort *)(local_15d8 + lVar39 * 8);
        uVar10 = *(ushort *)(local_15d8 + 2 + lVar39 * 8);
        uVar40 = *(uint *)(local_15d8 + 0x88);
        uVar11 = *(uint *)(local_15d8 + 4 + lVar39 * 8);
        pGVar13 = (context->scene->geometries).items[uVar40].ptr;
        lVar39 = *(long *)&pGVar13->field_0x58;
        lVar48 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)uVar11;
        uVar44 = uVar9 & 0x7fff;
        uVar45 = uVar10 & 0x7fff;
        uVar12 = *(uint *)(lVar39 + 4 + lVar48);
        uVar47 = (ulong)uVar12;
        uVar46 = (ulong)(uVar12 * uVar45 + *(int *)(lVar39 + lVar48) + uVar44);
        p_Var14 = pGVar13[1].intersectionFilterN;
        lVar15 = *(long *)&pGVar13[1].time_range.upper;
        auVar55 = *(undefined1 (*) [16])(lVar15 + (uVar46 + 1) * (long)p_Var14);
        auVar23 = *(undefined1 (*) [16])(lVar15 + (uVar46 + uVar47) * (long)p_Var14);
        lVar54 = uVar46 + uVar47 + 1;
        auVar24 = *(undefined1 (*) [16])(lVar15 + lVar54 * (long)p_Var14);
        auVar4 = *(undefined1 (*) [16])(lVar15 + (uVar46 + (-1 < (short)uVar9) + 1) * (long)p_Var14)
        ;
        lVar52 = (ulong)(-1 < (short)uVar9) + lVar54;
        auVar5 = *(undefined1 (*) [16])(lVar15 + lVar52 * (long)p_Var14);
        uVar43 = 0;
        if (-1 < (short)uVar10) {
          uVar43 = uVar47;
        }
        auVar6 = *(undefined1 (*) [16])(lVar15 + (uVar46 + uVar47 + uVar43) * (long)p_Var14);
        auVar7 = *(undefined1 (*) [16])(lVar15 + (lVar54 + uVar43) * (long)p_Var14);
        auVar91._16_16_ = *(undefined1 (*) [16])(lVar15 + (uVar43 + lVar52) * (long)p_Var14);
        auVar91._0_16_ = auVar24;
        auVar84 = vunpcklps_avx(auVar55,auVar5);
        auVar8 = vunpckhps_avx(auVar55,auVar5);
        auVar90 = vunpcklps_avx(auVar4,auVar24);
        auVar4 = vunpckhps_avx(auVar4,auVar24);
        auVar73 = vunpcklps_avx(auVar8,auVar4);
        auVar61 = vunpcklps_avx(auVar84,auVar90);
        auVar4 = vunpckhps_avx(auVar84,auVar90);
        auVar84 = vunpcklps_avx(auVar23,auVar7);
        auVar8 = vunpckhps_avx(auVar23,auVar7);
        auVar90 = vunpcklps_avx(auVar24,auVar6);
        auVar6 = vunpckhps_avx(auVar24,auVar6);
        auVar8 = vunpcklps_avx(auVar8,auVar6);
        auVar16 = vunpcklps_avx(auVar84,auVar90);
        auVar6 = vunpckhps_avx(auVar84,auVar90);
        auVar75._16_16_ = auVar7;
        auVar75._0_16_ = auVar23;
        auVar62._16_16_ = auVar5;
        auVar62._0_16_ = auVar55;
        auVar98 = vunpcklps_avx(auVar62,auVar75);
        auVar56._16_16_ = auVar24;
        auVar56._0_16_ = *(undefined1 (*) [16])(lVar15 + (long)p_Var14 * uVar46);
        auVar74 = vunpcklps_avx(auVar56,auVar91);
        auVar82 = vunpcklps_avx(auVar74,auVar98);
        auVar83 = vunpckhps_avx(auVar74,auVar98);
        auVar98 = vunpckhps_avx(auVar62,auVar75);
        auVar74 = vunpckhps_avx(auVar56,auVar91);
        auVar56 = vunpcklps_avx(auVar74,auVar98);
        auVar57._16_16_ = auVar61;
        auVar57._0_16_ = auVar61;
        auVar76._16_16_ = auVar4;
        auVar76._0_16_ = auVar4;
        auVar85._16_16_ = auVar73;
        auVar85._0_16_ = auVar73;
        auVar88._16_16_ = auVar16;
        auVar88._0_16_ = auVar16;
        auVar96._16_16_ = auVar6;
        auVar96._0_16_ = auVar6;
        auVar100._16_16_ = auVar8;
        auVar100._0_16_ = auVar8;
        auVar74 = vsubps_avx(auVar82,auVar57);
        auVar98 = vsubps_avx(auVar83,auVar76);
        auVar78 = vsubps_avx(auVar56,auVar85);
        auVar79 = vsubps_avx(auVar88,auVar82);
        auVar80 = vsubps_avx(auVar96,auVar83);
        auVar81 = vsubps_avx(auVar100,auVar56);
        auVar25._4_4_ = auVar98._4_4_ * auVar81._4_4_;
        auVar25._0_4_ = auVar98._0_4_ * auVar81._0_4_;
        auVar25._8_4_ = auVar98._8_4_ * auVar81._8_4_;
        auVar25._12_4_ = auVar98._12_4_ * auVar81._12_4_;
        auVar25._16_4_ = auVar98._16_4_ * auVar81._16_4_;
        auVar25._20_4_ = auVar98._20_4_ * auVar81._20_4_;
        auVar25._24_4_ = auVar98._24_4_ * auVar81._24_4_;
        auVar25._28_4_ = auVar61._12_4_;
        auVar5 = vfmsub231ps_fma(auVar25,auVar80,auVar78);
        uVar41 = *(undefined4 *)(ray + k * 4);
        auVar102._4_4_ = uVar41;
        auVar102._0_4_ = uVar41;
        auVar102._8_4_ = uVar41;
        auVar102._12_4_ = uVar41;
        auVar102._16_4_ = uVar41;
        auVar102._20_4_ = uVar41;
        auVar102._24_4_ = uVar41;
        auVar102._28_4_ = uVar41;
        uVar41 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar105._4_4_ = uVar41;
        auVar105._0_4_ = uVar41;
        auVar105._8_4_ = uVar41;
        auVar105._12_4_ = uVar41;
        auVar105._16_4_ = uVar41;
        auVar105._20_4_ = uVar41;
        auVar105._24_4_ = uVar41;
        auVar105._28_4_ = uVar41;
        uVar41 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar108._4_4_ = uVar41;
        auVar108._0_4_ = uVar41;
        auVar108._8_4_ = uVar41;
        auVar108._12_4_ = uVar41;
        auVar108._16_4_ = uVar41;
        auVar108._20_4_ = uVar41;
        auVar108._24_4_ = uVar41;
        auVar108._28_4_ = uVar41;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar97._4_4_ = fVar1;
        auVar97._0_4_ = fVar1;
        auVar97._8_4_ = fVar1;
        auVar97._12_4_ = fVar1;
        auVar97._16_4_ = fVar1;
        auVar97._20_4_ = fVar1;
        auVar97._24_4_ = fVar1;
        auVar97._28_4_ = fVar1;
        auVar26._4_4_ = auVar78._4_4_ * auVar79._4_4_;
        auVar26._0_4_ = auVar78._0_4_ * auVar79._0_4_;
        auVar26._8_4_ = auVar78._8_4_ * auVar79._8_4_;
        auVar26._12_4_ = auVar78._12_4_ * auVar79._12_4_;
        auVar26._16_4_ = auVar78._16_4_ * auVar79._16_4_;
        auVar26._20_4_ = auVar78._20_4_ * auVar79._20_4_;
        auVar26._24_4_ = auVar78._24_4_ * auVar79._24_4_;
        auVar26._28_4_ = auVar4._12_4_;
        auVar82 = vsubps_avx(auVar82,auVar102);
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        auVar103._4_4_ = fVar2;
        auVar103._0_4_ = fVar2;
        auVar103._8_4_ = fVar2;
        auVar103._12_4_ = fVar2;
        auVar103._16_4_ = fVar2;
        auVar103._20_4_ = fVar2;
        auVar103._24_4_ = fVar2;
        auVar103._28_4_ = fVar2;
        auVar4 = vfmsub231ps_fma(auVar26,auVar81,auVar74);
        auVar83 = vsubps_avx(auVar83,auVar105);
        fVar3 = *(float *)(ray + k * 4 + 0x60);
        auVar106._4_4_ = fVar3;
        auVar106._0_4_ = fVar3;
        auVar106._8_4_ = fVar3;
        auVar106._12_4_ = fVar3;
        auVar106._16_4_ = fVar3;
        auVar106._20_4_ = fVar3;
        auVar106._24_4_ = fVar3;
        auVar106._28_4_ = fVar3;
        auVar56 = vsubps_avx(auVar56,auVar108);
        auVar27._4_4_ = fVar1 * auVar83._4_4_;
        auVar27._0_4_ = fVar1 * auVar83._0_4_;
        auVar27._8_4_ = fVar1 * auVar83._8_4_;
        auVar27._12_4_ = fVar1 * auVar83._12_4_;
        auVar27._16_4_ = fVar1 * auVar83._16_4_;
        auVar27._20_4_ = fVar1 * auVar83._20_4_;
        auVar27._24_4_ = fVar1 * auVar83._24_4_;
        auVar27._28_4_ = uVar41;
        auVar55 = vfmsub231ps_fma(auVar27,auVar82,auVar103);
        auVar28._4_4_ = auVar81._4_4_ * auVar55._4_4_;
        auVar28._0_4_ = auVar81._0_4_ * auVar55._0_4_;
        auVar28._8_4_ = auVar81._8_4_ * auVar55._8_4_;
        auVar28._12_4_ = auVar81._12_4_ * auVar55._12_4_;
        auVar28._16_4_ = auVar81._16_4_ * 0.0;
        auVar28._20_4_ = auVar81._20_4_ * 0.0;
        auVar28._24_4_ = auVar81._24_4_ * 0.0;
        auVar28._28_4_ = auVar81._28_4_;
        auVar29._4_4_ = auVar78._4_4_ * auVar55._4_4_;
        auVar29._0_4_ = auVar78._0_4_ * auVar55._0_4_;
        auVar29._8_4_ = auVar78._8_4_ * auVar55._8_4_;
        auVar29._12_4_ = auVar78._12_4_ * auVar55._12_4_;
        auVar29._16_4_ = auVar78._16_4_ * 0.0;
        auVar29._20_4_ = auVar78._20_4_ * 0.0;
        auVar29._24_4_ = auVar78._24_4_ * 0.0;
        auVar29._28_4_ = auVar78._28_4_;
        auVar109._0_4_ = fVar3 * auVar82._0_4_;
        auVar109._4_4_ = fVar3 * auVar82._4_4_;
        auVar109._8_4_ = fVar3 * auVar82._8_4_;
        auVar109._12_4_ = fVar3 * auVar82._12_4_;
        auVar109._16_4_ = fVar3 * auVar82._16_4_;
        auVar109._20_4_ = fVar3 * auVar82._20_4_;
        auVar109._24_4_ = fVar3 * auVar82._24_4_;
        auVar109._28_4_ = 0;
        auVar23 = vfmsub231ps_fma(auVar109,auVar56,auVar97);
        auVar55 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar23),auVar80);
        auVar23 = vfmadd231ps_fma(auVar29,auVar98,ZEXT1632(auVar23));
        auVar30._4_4_ = auVar74._4_4_ * auVar80._4_4_;
        auVar30._0_4_ = auVar74._0_4_ * auVar80._0_4_;
        auVar30._8_4_ = auVar74._8_4_ * auVar80._8_4_;
        auVar30._12_4_ = auVar74._12_4_ * auVar80._12_4_;
        auVar30._16_4_ = auVar74._16_4_ * auVar80._16_4_;
        auVar30._20_4_ = auVar74._20_4_ * auVar80._20_4_;
        auVar30._24_4_ = auVar74._24_4_ * auVar80._24_4_;
        auVar30._28_4_ = auVar80._28_4_;
        auVar24 = vfmsub231ps_fma(auVar30,auVar79,auVar98);
        auVar110._0_4_ = fVar2 * auVar56._0_4_;
        auVar110._4_4_ = fVar2 * auVar56._4_4_;
        auVar110._8_4_ = fVar2 * auVar56._8_4_;
        auVar110._12_4_ = fVar2 * auVar56._12_4_;
        auVar110._16_4_ = fVar2 * auVar56._16_4_;
        auVar110._20_4_ = fVar2 * auVar56._20_4_;
        auVar110._24_4_ = fVar2 * auVar56._24_4_;
        auVar110._28_4_ = 0;
        auVar6 = vfmsub231ps_fma(auVar110,auVar83,auVar106);
        fVar1 = auVar24._0_4_;
        fVar2 = auVar24._4_4_;
        auVar31._4_4_ = fVar3 * fVar2;
        auVar31._0_4_ = fVar3 * fVar1;
        fVar60 = auVar24._8_4_;
        auVar31._8_4_ = fVar3 * fVar60;
        fVar65 = auVar24._12_4_;
        auVar31._12_4_ = fVar3 * fVar65;
        auVar31._16_4_ = fVar3 * 0.0;
        auVar31._20_4_ = fVar3 * 0.0;
        auVar31._24_4_ = fVar3 * 0.0;
        auVar31._28_4_ = fVar3;
        auVar24 = vfmadd231ps_fma(auVar31,ZEXT1632(auVar4),auVar103);
        auVar104 = ZEXT3264(local_1540);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar5),auVar97);
        auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar6),auVar79);
        auVar98 = vandps_avx(ZEXT1632(auVar24),local_13a0);
        uVar12 = auVar98._0_4_;
        auVar92._0_4_ = (float)(auVar55._0_4_ ^ uVar12);
        uVar17 = auVar98._4_4_;
        auVar92._4_4_ = (float)(auVar55._4_4_ ^ uVar17);
        uVar18 = auVar98._8_4_;
        auVar92._8_4_ = (float)(auVar55._8_4_ ^ uVar18);
        uVar19 = auVar98._12_4_;
        auVar92._12_4_ = (float)(auVar55._12_4_ ^ uVar19);
        fVar3 = auVar98._16_4_;
        auVar92._16_4_ = fVar3;
        fVar20 = auVar98._20_4_;
        auVar92._20_4_ = fVar20;
        fVar21 = auVar98._24_4_;
        auVar92._24_4_ = fVar21;
        fVar22 = auVar98._28_4_;
        auVar92._28_4_ = fVar22;
        auVar55 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar74,ZEXT1632(auVar6));
        auVar111 = ZEXT3264(local_1580);
        auVar94._0_4_ = (float)(auVar55._0_4_ ^ uVar12);
        auVar94._4_4_ = (float)(auVar55._4_4_ ^ uVar17);
        auVar94._8_4_ = (float)(auVar55._8_4_ ^ uVar18);
        auVar94._12_4_ = (float)(auVar55._12_4_ ^ uVar19);
        auVar94._16_4_ = fVar3;
        auVar94._20_4_ = fVar20;
        auVar94._24_4_ = fVar21;
        auVar94._28_4_ = fVar22;
        auVar98 = vcmpps_avx(auVar92,ZEXT832(0) << 0x20,5);
        auVar74 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,5);
        auVar98 = vandps_avx(auVar74,auVar98);
        auVar63._8_4_ = 0x7fffffff;
        auVar63._0_8_ = 0x7fffffff7fffffff;
        auVar63._12_4_ = 0x7fffffff;
        auVar63._16_4_ = 0x7fffffff;
        auVar63._20_4_ = 0x7fffffff;
        auVar63._24_4_ = 0x7fffffff;
        auVar63._28_4_ = 0x7fffffff;
        local_1320 = vandps_avx(ZEXT1632(auVar24),auVar63);
        auVar74 = vcmpps_avx(ZEXT1632(auVar24),ZEXT832(0) << 0x20,4);
        auVar107 = ZEXT3264(local_1560);
        auVar98 = vandps_avx(auVar98,auVar74);
        auVar101._0_4_ = auVar92._0_4_ + auVar94._0_4_;
        auVar101._4_4_ = auVar92._4_4_ + auVar94._4_4_;
        auVar101._8_4_ = auVar92._8_4_ + auVar94._8_4_;
        auVar101._12_4_ = auVar92._12_4_ + auVar94._12_4_;
        auVar101._16_4_ = fVar3 + fVar3;
        auVar101._20_4_ = fVar20 + fVar20;
        auVar101._24_4_ = fVar21 + fVar21;
        auVar101._28_4_ = fVar22 + fVar22;
        auVar74 = vcmpps_avx(auVar101,local_1320,2);
        auVar78 = auVar74 & auVar98;
        if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar78 >> 0x7f,0) != '\0') ||
              (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar78 >> 0xbf,0) != '\0') ||
            (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar78[0x1f] < '\0') {
          auVar98 = vandps_avx(auVar98,auVar74);
          auVar55 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
          auVar32._4_4_ = fVar2 * auVar56._4_4_;
          auVar32._0_4_ = fVar1 * auVar56._0_4_;
          auVar32._8_4_ = fVar60 * auVar56._8_4_;
          auVar32._12_4_ = fVar65 * auVar56._12_4_;
          auVar32._16_4_ = auVar56._16_4_ * 0.0;
          auVar32._20_4_ = auVar56._20_4_ * 0.0;
          auVar32._24_4_ = auVar56._24_4_ * 0.0;
          auVar32._28_4_ = auVar56._28_4_;
          auVar23 = vfmadd213ps_fma(auVar83,ZEXT1632(auVar4),auVar32);
          auVar23 = vfmadd213ps_fma(auVar82,ZEXT1632(auVar5),ZEXT1632(auVar23));
          local_1340._0_4_ = (float)(uVar12 ^ auVar23._0_4_);
          local_1340._4_4_ = (float)(uVar17 ^ auVar23._4_4_);
          local_1340._8_4_ = (float)(uVar18 ^ auVar23._8_4_);
          local_1340._12_4_ = (float)(uVar19 ^ auVar23._12_4_);
          local_1340._16_4_ = fVar3;
          local_1340._20_4_ = fVar20;
          local_1340._24_4_ = fVar21;
          local_1340._28_4_ = fVar22;
          fVar99 = *(float *)(ray + k * 4 + 0x30);
          fVar59 = local_1320._0_4_;
          fVar64 = local_1320._4_4_;
          auVar33._4_4_ = fVar64 * fVar99;
          auVar33._0_4_ = fVar59 * fVar99;
          fVar66 = local_1320._8_4_;
          auVar33._8_4_ = fVar66 * fVar99;
          fVar68 = local_1320._12_4_;
          auVar33._12_4_ = fVar68 * fVar99;
          fVar70 = local_1320._16_4_;
          auVar33._16_4_ = fVar70 * fVar99;
          fVar71 = local_1320._20_4_;
          auVar33._20_4_ = fVar71 * fVar99;
          fVar72 = local_1320._24_4_;
          auVar33._24_4_ = fVar72 * fVar99;
          auVar33._28_4_ = fVar99;
          auVar98 = vcmpps_avx(auVar33,local_1340,1);
          fVar99 = *(float *)(ray + k * 4 + 0x80);
          auVar34._4_4_ = fVar64 * fVar99;
          auVar34._0_4_ = fVar59 * fVar99;
          auVar34._8_4_ = fVar66 * fVar99;
          auVar34._12_4_ = fVar68 * fVar99;
          auVar34._16_4_ = fVar70 * fVar99;
          auVar34._20_4_ = fVar71 * fVar99;
          auVar34._24_4_ = fVar72 * fVar99;
          auVar34._28_4_ = auVar56._28_4_;
          auVar74 = vcmpps_avx(local_1340,auVar34,2);
          auVar98 = vandps_avx(auVar98,auVar74);
          auVar23 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
          auVar55 = vpand_avx(auVar55,auVar23);
          auVar98 = vpmovzxwd_avx2(auVar55);
          auVar98 = vpslld_avx2(auVar98,0x1f);
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            auVar74 = vsubps_avx(local_1320,auVar94);
            local_1380 = vblendvps_avx(auVar92,auVar74,local_1440);
            auVar74 = vsubps_avx(local_1320,auVar92);
            local_1360 = vblendvps_avx(auVar94,auVar74,local_1440);
            local_12e0 = vpsrad_avx2(auVar98,0x1f);
            local_1260._0_4_ = (float)local_1460._0_4_ * auVar5._0_4_;
            local_1260._4_4_ = (float)local_1460._4_4_ * auVar5._4_4_;
            local_1260._8_4_ = fStack_1458 * auVar5._8_4_;
            local_1260._12_4_ = fStack_1454 * auVar5._12_4_;
            local_1260._16_4_ = fStack_1450 * 0.0;
            local_1260._20_4_ = fStack_144c * 0.0;
            local_1260._24_4_ = fStack_1448 * 0.0;
            local_1260._28_4_ = 0;
            local_1240._4_4_ = (float)local_1460._4_4_ * auVar4._4_4_;
            local_1240._0_4_ = (float)local_1460._0_4_ * auVar4._0_4_;
            local_1240._8_4_ = fStack_1458 * auVar4._8_4_;
            local_1240._12_4_ = fStack_1454 * auVar4._12_4_;
            local_1240._16_4_ = fStack_1450 * 0.0;
            local_1240._20_4_ = fStack_144c * 0.0;
            local_1240._24_4_ = fStack_1448 * 0.0;
            local_1240._28_4_ = 0;
            local_1220._4_4_ = (float)local_1460._4_4_ * fVar2;
            local_1220._0_4_ = (float)local_1460._0_4_ * fVar1;
            local_1220._8_4_ = fStack_1458 * fVar60;
            local_1220._12_4_ = fStack_1454 * fVar65;
            local_1220._16_4_ = fStack_1450 * 0.0;
            local_1220._20_4_ = fStack_144c * 0.0;
            local_1220._24_4_ = fStack_1448 * 0.0;
            local_1220._28_4_ = 0;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01691363:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_0169137d;
              }
              auVar58._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
              auVar58._8_4_ = uVar44;
              auVar58._12_4_ = uVar44;
              auVar58._16_4_ = uVar44;
              auVar58._20_4_ = uVar44;
              auVar58._24_4_ = uVar44;
              auVar58._28_4_ = uVar44;
              auVar98 = vpaddd_avx2(auVar58,_DAT_01fb7740);
              auVar77._0_8_ = (ulong)CONCAT24(uVar10,(uint)uVar10) & 0x7fff00007fff;
              auVar77._8_4_ = uVar45;
              auVar77._12_4_ = uVar45;
              auVar77._16_4_ = uVar45;
              auVar77._20_4_ = uVar45;
              auVar77._24_4_ = uVar45;
              auVar77._28_4_ = uVar45;
              auVar74 = vpaddd_avx2(auVar77,_DAT_01fb7760);
              auVar84._0_4_ = (float)(int)(*(ushort *)(lVar39 + 8 + lVar48) - 1);
              auVar84._4_12_ = auVar112._4_12_;
              auVar23 = vrcpss_avx(auVar84,auVar84);
              auVar24 = vfnmadd213ss_fma(auVar84,auVar23,SUB6416(ZEXT464(0x40000000),0));
              fVar1 = auVar23._0_4_ * auVar24._0_4_;
              auVar90._0_4_ = (float)(int)(*(ushort *)(lVar39 + 10 + lVar48) - 1);
              auVar90._4_12_ = auVar112._4_12_;
              auVar23 = vrcpss_avx(auVar90,auVar90);
              auVar24 = vfnmadd213ss_fma(auVar90,auVar23,SUB6416(ZEXT464(0x40000000),0));
              fVar2 = auVar23._0_4_ * auVar24._0_4_;
              auVar98 = vcvtdq2ps_avx(auVar98);
              fStack_12a4 = auVar98._28_4_ + local_1380._28_4_;
              auVar74 = vcvtdq2ps_avx(auVar74);
              auVar78 = vrcpps_avx(local_1320);
              auVar86._8_4_ = 0x3f800000;
              auVar86._0_8_ = 0x3f8000003f800000;
              auVar86._12_4_ = 0x3f800000;
              auVar86._16_4_ = 0x3f800000;
              auVar86._20_4_ = 0x3f800000;
              auVar86._24_4_ = 0x3f800000;
              auVar86._28_4_ = 0x3f800000;
              auVar23 = vfnmadd213ps_fma(local_1320,auVar78,auVar86);
              auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar78,auVar78);
              fVar60 = auVar23._0_4_;
              fVar65 = auVar23._4_4_;
              local_1280._4_4_ = fVar65 * local_1340._4_4_;
              local_1280._0_4_ = fVar60 * local_1340._0_4_;
              fVar67 = auVar23._8_4_;
              local_1280._8_4_ = fVar67 * local_1340._8_4_;
              fVar69 = auVar23._12_4_;
              local_1280._12_4_ = fVar69 * local_1340._12_4_;
              local_1280._16_4_ = fVar3 * 0.0;
              local_1280._20_4_ = fVar20 * 0.0;
              local_1280._24_4_ = fVar21 * 0.0;
              local_1280._28_4_ = fVar22;
              local_12c0[0] = (fVar59 * auVar98._0_4_ + local_1380._0_4_) * fVar1 * fVar60;
              local_12c0[1] = (fVar64 * auVar98._4_4_ + local_1380._4_4_) * fVar1 * fVar65;
              local_12c0[2] = (fVar66 * auVar98._8_4_ + local_1380._8_4_) * fVar1 * fVar67;
              local_12c0[3] = (fVar68 * auVar98._12_4_ + local_1380._12_4_) * fVar1 * fVar69;
              fStack_12b0 = (fVar70 * auVar98._16_4_ + local_1380._16_4_) * fVar1 * 0.0;
              fStack_12ac = (fVar71 * auVar98._20_4_ + local_1380._20_4_) * fVar1 * 0.0;
              fStack_12a8 = (fVar72 * auVar98._24_4_ + local_1380._24_4_) * fVar1 * 0.0;
              local_12a0[0] = (fVar59 * auVar74._0_4_ + local_1360._0_4_) * fVar2 * fVar60;
              local_12a0[1] = (fVar64 * auVar74._4_4_ + local_1360._4_4_) * fVar2 * fVar65;
              local_12a0[2] = (fVar66 * auVar74._8_4_ + local_1360._8_4_) * fVar2 * fVar67;
              local_12a0[3] = (fVar68 * auVar74._12_4_ + local_1360._12_4_) * fVar2 * fVar69;
              fStack_1290 = (fVar70 * auVar74._16_4_ + local_1360._16_4_) * fVar2 * 0.0;
              fStack_128c = (fVar71 * auVar74._20_4_ + local_1360._20_4_) * fVar2 * 0.0;
              fStack_1288 = (fVar72 * auVar74._24_4_ + local_1360._24_4_) * fVar2 * 0.0;
              fStack_1284 = fStack_12a4;
              auVar55 = vpsllw_avx(auVar55,0xf);
              auVar55 = vpacksswb_avx(auVar55,auVar55);
              uVar43 = 0;
              uVar47 = (ulong)(byte)(SUB161(auVar55 >> 7,0) & 1 |
                                     (SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar55 >> 0x3f,0) << 7);
              for (uVar46 = uVar47; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                uVar43 = uVar43 + 1;
              }
              local_1690 = CONCAT44(uVar11,uVar11);
              local_1520 = auVar112._0_32_;
              local_15a0 = fVar99;
              fStack_159c = fVar99;
              fStack_1598 = fVar99;
              fStack_1594 = fVar99;
              fStack_1590 = fVar99;
              fStack_158c = fVar99;
              fStack_1588 = fVar99;
              fStack_1584 = fVar99;
              while (uVar47 != 0) {
                local_14c0 = local_12c0[uVar43];
                local_14b0 = local_12a0[uVar43];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1280 + uVar43 * 4);
                local_15d0.context = context->user;
                local_14f0 = *(undefined4 *)(local_1260 + uVar43 * 4);
                uVar41 = *(undefined4 *)(local_1240 + uVar43 * 4);
                local_14e0._4_4_ = uVar41;
                local_14e0._0_4_ = uVar41;
                local_14e0._8_4_ = uVar41;
                local_14e0._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(local_1220 + uVar43 * 4);
                local_14d0._4_4_ = uVar41;
                local_14d0._0_4_ = uVar41;
                local_14d0._8_4_ = uVar41;
                local_14d0._12_4_ = uVar41;
                uStack_1498 = CONCAT44(uVar11,uVar11);
                local_14a0 = local_1690;
                local_1490._4_4_ = uVar40;
                local_1490._0_4_ = uVar40;
                local_1490._8_4_ = uVar40;
                local_1490._12_4_ = uVar40;
                vpcmpeqd_avx2(ZEXT1632(local_1490),ZEXT1632(local_1490));
                uStack_147c = (local_15d0.context)->instID[0];
                local_1480 = uStack_147c;
                uStack_1478 = uStack_147c;
                uStack_1474 = uStack_147c;
                uStack_1470 = (local_15d0.context)->instPrimID[0];
                uStack_146c = uStack_1470;
                uStack_1468 = uStack_1470;
                uStack_1464 = uStack_1470;
                local_1670 = *local_1658;
                local_15d0.valid = (int *)local_1670;
                local_15d0.geometryUserPtr = pGVar13->userPtr;
                local_15d0.hit = (RTCHitN *)&local_14f0;
                local_15d0.N = 4;
                local_15d0.ray = (RTCRayN *)ray;
                uStack_14ec = local_14f0;
                uStack_14e8 = local_14f0;
                uStack_14e4 = local_14f0;
                fStack_14bc = local_14c0;
                fStack_14b8 = local_14c0;
                fStack_14b4 = local_14c0;
                fStack_14ac = local_14b0;
                fStack_14a8 = local_14b0;
                fStack_14a4 = local_14b0;
                if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar13->occlusionFilterN)(&local_15d0);
                  auVar111 = ZEXT3264(local_1580);
                  auVar107 = ZEXT3264(local_1560);
                  auVar104 = ZEXT3264(local_1540);
                  auVar112 = ZEXT3264(local_1520);
                  fVar99 = local_15a0;
                }
                if (local_1670 == (undefined1  [16])0x0) {
                  auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar55 = auVar55 ^ _DAT_01f46b70;
                }
                else {
                  p_Var14 = context->args->filter;
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var14)(&local_15d0);
                    auVar111 = ZEXT3264(local_1580);
                    auVar107 = ZEXT3264(local_1560);
                    auVar104 = ZEXT3264(local_1540);
                    auVar112 = ZEXT3264(local_1520);
                    fVar99 = local_15a0;
                  }
                  auVar23 = vpcmpeqd_avx(local_1670,_DAT_01f45a50);
                  auVar55 = auVar23 ^ _DAT_01f46b70;
                  auVar73._8_4_ = 0xff800000;
                  auVar73._0_8_ = 0xff800000ff800000;
                  auVar73._12_4_ = 0xff800000;
                  auVar23 = vblendvps_avx(auVar73,*(undefined1 (*) [16])(local_15d0.ray + 0x80),
                                          auVar23);
                  *(undefined1 (*) [16])(local_15d0.ray + 0x80) = auVar23;
                }
                auVar61._8_8_ = 0x100000001;
                auVar61._0_8_ = 0x100000001;
                if ((auVar61 & auVar55) != (undefined1  [16])0x0) goto LAB_01691363;
                *(float *)(ray + k * 4 + 0x80) = fVar99;
                uVar46 = uVar43 & 0x3f;
                uVar43 = 0;
                uVar47 = uVar47 ^ 1L << uVar46;
                for (uVar46 = uVar47; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000)
                {
                  uVar43 = uVar43 + 1;
                }
              }
            }
          }
        }
        uVar43 = local_1608;
        uVar46 = local_15e0;
        uVar47 = local_15e8;
        uVar49 = local_15f0;
        uVar50 = local_15f8;
        uVar51 = local_1600;
      }
      auVar87 = ZEXT3264(local_13c0);
      auVar89 = ZEXT3264(local_13e0);
      auVar93 = ZEXT3264(local_1400);
      auVar95 = ZEXT3264(local_1420);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }